

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O3

void __thiscall xercesc_4_0::BMPattern::initialize(BMPattern *this)

{
  short *psVar1;
  bool bVar2;
  XMLSize_t *pXVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  XMLCh *pXVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  ArrayJanitor<char16_t> janLowercase;
  ArrayJanitor<char16_t> AStack_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar19;
  
  uVar16 = 0;
  if (this->fPattern != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPattern + uVar16);
      uVar16 = uVar16 + 2;
    } while (*psVar1 != 0);
    uVar16 = ((long)uVar16 >> 1) - 1;
  }
  iVar8 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(ulong)this->fShiftTableLen << 3);
  this->fShiftTable = (XMLSize_t *)CONCAT44(extraout_var,iVar8);
  if (this->fIgnoreCase != true) {
    pXVar10 = (char16_t *)0x0;
    goto LAB_00236824;
  }
  pXVar10 = this->fPattern;
  if (pXVar10 == (XMLCh *)0x0) {
    this->fUppercasePattern = (XMLCh *)0x0;
    pXVar9 = (XMLCh *)0x0;
LAB_00236811:
    pXVar10 = (XMLCh *)0x0;
  }
  else {
    sVar15 = 0;
    do {
      psVar1 = (short *)((long)pXVar10 + sVar15);
      sVar15 = sVar15 + 2;
    } while (*psVar1 != 0);
    iVar8 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar15);
    pXVar9 = (XMLCh *)CONCAT44(extraout_var_00,iVar8);
    memcpy(pXVar9,pXVar10,sVar15);
    pXVar11 = this->fPattern;
    this->fUppercasePattern = pXVar9;
    if (pXVar11 == (XMLCh *)0x0) goto LAB_00236811;
    sVar15 = 0;
    do {
      psVar1 = (short *)((long)pXVar11 + sVar15);
      sVar15 = sVar15 + 2;
    } while (*psVar1 != 0);
    iVar8 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar15);
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_01,iVar8);
    memcpy(pXVar10,pXVar11,sVar15);
    pXVar9 = this->fUppercasePattern;
  }
  XMLString::upperCase(pXVar9);
  XMLString::lowerCase(pXVar10);
LAB_00236824:
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,pXVar10,this->fMemoryManager);
  auVar6 = _DAT_00357640;
  uVar12 = (ulong)this->fShiftTableLen;
  if (uVar12 != 0) {
    pXVar3 = this->fShiftTable;
    lVar19 = uVar12 - 1;
    auVar17._8_4_ = (int)lVar19;
    auVar17._0_8_ = lVar19;
    auVar17._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar13 = 0;
    auVar17 = auVar17 ^ _DAT_00357640;
    auVar18 = _DAT_00357630;
    do {
      auVar20 = auVar18 ^ auVar6;
      if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                  auVar17._4_4_ < auVar20._4_4_) & 1)) {
        *(ulong *)((long)pXVar3 + uVar13) = uVar16;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        *(ulong *)((long)pXVar3 + uVar13 + 8) = uVar16;
      }
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar19 + 2;
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 * 8 + 8 & 0xfffffffffffffff0) != uVar13);
  }
  if (uVar16 != 0) {
    pXVar9 = this->fPattern;
    pXVar3 = this->fShiftTable;
    bVar2 = this->fIgnoreCase;
    uVar13 = 0;
    do {
      uVar14 = ~uVar13 + uVar16;
      uVar4 = (ulong)(ushort)pXVar9[uVar13] % uVar12;
      if (uVar14 < pXVar3[uVar4]) {
        pXVar3[uVar4] = uVar14;
      }
      if (bVar2 != false) {
        bVar7 = true;
        do {
          bVar5 = bVar7;
          pXVar11 = pXVar10;
          if (bVar5) {
            pXVar11 = this->fUppercasePattern;
          }
          if (uVar14 < pXVar3[(ulong)(ushort)pXVar11[uVar13] % uVar12]) {
            pXVar3[(ulong)(ushort)pXVar11[uVar13] % uVar12] = uVar14;
          }
          bVar7 = false;
        } while (bVar5);
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 & 0xffffffff) < uVar16);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
  return;
}

Assistant:

void BMPattern::initialize() {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    XMLCh* lowercasePattern = 0;

    fShiftTable = (XMLSize_t*) fMemoryManager->allocate(fShiftTableLen*sizeof(XMLSize_t)); //new XMLSize_t[fShiftTableLen];

    if (fIgnoreCase) {

        fUppercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        lowercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        XMLString::upperCase(fUppercasePattern);
        XMLString::lowerCase(lowercasePattern);
    }

    ArrayJanitor<XMLCh> janLowercase(lowercasePattern, fMemoryManager);

    for (unsigned int i=0; i< fShiftTableLen; i++)
        fShiftTable[i] = patternLen;

    for (unsigned int k=0; k< patternLen; k++) {

        XMLCh      ch = fPattern[k];
        XMLSize_t diff = patternLen - k - 1;
        int          index = ch % fShiftTableLen;

        if (diff < fShiftTable[index])
            fShiftTable[index] = diff;

        if (fIgnoreCase) {

            for (int j=0; j< 2; j++) {

                ch = (j == 0) ? fUppercasePattern[k] : lowercasePattern[k];
                index = ch % fShiftTableLen;

                if (diff < fShiftTable[index])
                    fShiftTable[index] = diff;
            }
        }
    }
}